

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O0

void __thiscall t_xml_generator::write_const_value(t_xml_generator *this,t_const_value *value)

{
  bool bVar1;
  t_const_value_type tVar2;
  int64_t n;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *__x;
  reference pptVar3;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *pmVar4;
  pointer ppVar5;
  ostream *poVar6;
  double n_00;
  string local_248;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  _Self local_1b0;
  _Base_ptr local_1a8;
  _Rb_tree_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_1a0;
  iterator mit;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  map;
  string local_160;
  allocator local_139;
  string local_138;
  __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_118;
  t_const_value **local_110;
  __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_108;
  iterator lit;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> list;
  string local_e0;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  t_const_value *local_18;
  t_const_value *value_local;
  t_xml_generator *this_local;
  
  local_18 = value;
  value_local = (t_const_value *)this;
  tVar2 = t_const_value::get_type(value);
  switch(tVar2) {
  case CV_INTEGER:
  case CV_IDENTIFIER:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"int",&local_39);
    n = t_const_value::get_integer(local_18);
    write_element_number<long>(this,&local_38,n);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    break;
  case CV_DOUBLE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"double",&local_71);
    n_00 = t_const_value::get_double(local_18);
    write_element_number<double>(this,&local_70,n_00);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    break;
  case CV_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"string",&local_99);
    t_const_value::get_string_abi_cxx11_(&local_c0,local_18);
    write_element_string(this,&local_98,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    break;
  case CV_MAP:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_160,"map",
               (allocator *)((long)&map._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    write_element_start(this,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&map._M_t._M_impl.super__Rb_tree_header._M_node_count + 7))
    ;
    pmVar4 = t_const_value::get_map(local_18);
    std::
    map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::map((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
           *)&mit,pmVar4);
    std::_Rb_tree_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::_Rb_tree_iterator
              (&local_1a0);
    local_1a8 = (_Base_ptr)
                std::
                map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                ::begin((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                         *)&mit);
    local_1a0._M_node = local_1a8;
    while( true ) {
      local_1b0._M_node =
           (_Base_ptr)
           std::
           map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
           ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                  *)&mit);
      bVar1 = std::operator!=(&local_1a0,&local_1b0);
      if (!bVar1) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d0,"entry",&local_1d1);
      write_element_start(this,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f8,"key",&local_1f9);
      write_element_start(this,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      ppVar5 = std::_Rb_tree_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::operator->
                         (&local_1a0);
      write_const_value(this,ppVar5->first);
      write_element_end(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_220,"value",&local_221);
      write_element_start(this,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      ppVar5 = std::_Rb_tree_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::operator->
                         (&local_1a0);
      write_const_value(this,ppVar5->second);
      write_element_end(this);
      write_element_end(this);
      std::_Rb_tree_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::operator++
                (&local_1a0);
    }
    write_element_end(this);
    std::
    map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::~map((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
            *)&mit);
    break;
  case CV_LIST:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e0,"list",
               (allocator *)
               ((long)&list.super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    write_element_start(this,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&list.super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    __x = t_const_value::get_list(local_18);
    std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::vector
              ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)&lit,__x);
    __gnu_cxx::
    __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
    ::__normal_iterator(&local_108);
    local_110 = (t_const_value **)
                std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin
                          ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)&lit);
    local_108._M_current = local_110;
    while( true ) {
      local_118._M_current =
           (t_const_value **)
           std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end
                     ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)&lit);
      bVar1 = __gnu_cxx::operator!=(&local_108,&local_118);
      if (!bVar1) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_138,"entry",&local_139);
      write_element_start(this,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      pptVar3 = __gnu_cxx::
                __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                ::operator*(&local_108);
      write_const_value(this,*pptVar3);
      write_element_end(this);
      __gnu_cxx::
      __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
      ::operator++(&local_108);
    }
    write_element_end(this);
    std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::~vector
              ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)&lit);
    break;
  default:
    t_generator::indent_up(&this->super_t_generator);
    t_generator::indent_abi_cxx11_(&local_248,&this->super_t_generator);
    poVar6 = std::operator<<((ostream *)&this->f_xml_,(string *)&local_248);
    poVar6 = std::operator<<(poVar6,"<null />");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_248);
    t_generator::indent_down(&this->super_t_generator);
  }
  return;
}

Assistant:

void t_xml_generator::write_const_value(t_const_value* value) {

  switch (value->get_type()) {

  case t_const_value::CV_IDENTIFIER:
  case t_const_value::CV_INTEGER:
    write_element_number("int", value->get_integer());
    break;

  case t_const_value::CV_DOUBLE:
    write_element_number("double", value->get_double());
    break;

  case t_const_value::CV_STRING:
    write_element_string("string", value->get_string());
    break;

  case t_const_value::CV_LIST: {
    write_element_start("list");
    std::vector<t_const_value*> list = value->get_list();
    std::vector<t_const_value*>::iterator lit;
    for (lit = list.begin(); lit != list.end(); ++lit) {
      write_element_start("entry");
      write_const_value(*lit);
      write_element_end();
    }
    write_element_end();
    break;
  }

  case t_const_value::CV_MAP: {
    write_element_start("map");
    std::map<t_const_value*, t_const_value*, t_const_value::value_compare> map = value->get_map();
    std::map<t_const_value*, t_const_value*, t_const_value::value_compare>::iterator mit;
    for (mit = map.begin(); mit != map.end(); ++mit) {
      write_element_start("entry");
      write_element_start("key");
      write_const_value(mit->first);
      write_element_end();
      write_element_start("value");
      write_const_value(mit->second);
      write_element_end();
      write_element_end();
    }
    write_element_end();
    break;
  }

  default:
    indent_up();
    f_xml_ << indent() << "<null />" << endl;
    indent_down();
    break;
  }

}